

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O3

UTrie2 * utrie2_clone_63(UTrie2 *other,UErrorCode *pErrorCode)

{
  char cVar1;
  int iVar2;
  void *__src;
  UNewTrie2 *__src_00;
  uint32_t uVar3;
  int32_t iVar4;
  UTrie2 *buffer;
  void *__dest;
  UNewTrie2 *buffer_00;
  uint32_t *puVar5;
  long lVar6;
  UTrie2 *pUVar7;
  UTrie2 *pUVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UTrie2 *)0x0;
  }
  if ((other == (UTrie2 *)0x0) ||
     ((other->memory == (void *)0x0 && (other->newTrie == (UNewTrie2 *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UTrie2 *)0x0;
  }
  buffer = (UTrie2 *)uprv_malloc_63(0x50);
  if (buffer == (UTrie2 *)0x0) {
    return (UTrie2 *)0x0;
  }
  pUVar7 = other;
  pUVar8 = buffer;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pUVar8->index = pUVar7->index;
    pUVar7 = (UTrie2 *)((long)pUVar7 + (ulong)bVar9 * -0x10 + 8);
    pUVar8 = (UTrie2 *)((long)pUVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  if (other->memory != (void *)0x0) {
    __dest = uprv_malloc_63((long)other->length);
    buffer->memory = __dest;
    if (__dest != (void *)0x0) {
      buffer->isMemoryOwned = '\x01';
      __src = other->memory;
      memcpy(__dest,__src,(long)other->length);
      buffer->index = (uint16_t *)(((long)other->index - (long)__src) + (long)__dest);
      if (other->data16 != (uint16_t *)0x0) {
        buffer->data16 = (uint16_t *)(((long)other->data16 - (long)__src) + (long)__dest);
      }
      if (other->data32 != (uint32_t *)0x0) {
        buffer->data32 = (uint32_t *)((long)__dest + ((long)other->data32 - (long)__src));
        return buffer;
      }
      return buffer;
    }
    goto LAB_002d8a4a;
  }
  __src_00 = other->newTrie;
  buffer_00 = (UNewTrie2 *)uprv_malloc_63(0x453c0);
  if (buffer_00 == (UNewTrie2 *)0x0) {
LAB_002d8a38:
    buffer_00 = (UNewTrie2 *)0x0;
  }
  else {
    puVar5 = (uint32_t *)uprv_malloc_63((long)__src_00->dataCapacity << 2);
    buffer_00->data = puVar5;
    if (puVar5 == (uint32_t *)0x0) {
      uprv_free_63(buffer_00);
      goto LAB_002d8a38;
    }
    buffer_00->dataCapacity = __src_00->dataCapacity;
    memcpy(buffer_00,__src_00,0x880);
    iVar2 = __src_00->index2Length;
    memcpy(buffer_00->index2,__src_00->index2,(long)iVar2 << 2);
    buffer_00->index2NullOffset = __src_00->index2NullOffset;
    buffer_00->index2Length = iVar2;
    memcpy(buffer_00->data,__src_00->data,(long)__src_00->dataLength << 2);
    buffer_00->dataNullOffset = __src_00->dataNullOffset;
    iVar2 = __src_00->dataLength;
    buffer_00->dataLength = iVar2;
    cVar1 = __src_00->isCompacted;
    iVar4 = 0;
    if (cVar1 == '\0') {
      memcpy(buffer_00->map,__src_00->map,(ulong)(long)iVar2 >> 3 & 0xfffffffffffffffc);
      iVar4 = __src_00->firstFreeBlock;
    }
    buffer_00->firstFreeBlock = iVar4;
    uVar3 = __src_00->errorValue;
    buffer_00->initialValue = __src_00->initialValue;
    buffer_00->errorValue = uVar3;
    buffer_00->highStart = __src_00->highStart;
    buffer_00->isCompacted = cVar1;
  }
  buffer->newTrie = buffer_00;
  if (buffer->memory != (void *)0x0) {
    return buffer;
  }
LAB_002d8a4a:
  if (buffer->newTrie == (UNewTrie2 *)0x0) {
    uprv_free_63(buffer);
    return (UTrie2 *)0x0;
  }
  return buffer;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}